

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_compressionParameters *
ZSTD_adjustCParams(ZSTD_compressionParameters *__return_storage_ptr__,
                  ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize)

{
  ZSTD_compressionParameters cPar_00;
  ZSTD_strategy ZVar1;
  ZSTD_strategy ZVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  ZVar2 = ZSTD_btultra2;
  if ((int)cPar.strategy < 9) {
    ZVar2 = cPar.strategy;
  }
  ZVar1 = ZSTD_fast;
  if (1 < (int)ZVar2) {
    ZVar1 = ZVar2;
  }
  uVar3 = (uint)(0x1f < (int)cPar.windowLog) * 0x1f | (0x1f >= (int)cPar.windowLog) * cPar.windowLog
  ;
  uVar5 = (uint)(0x1e < (int)cPar.chainLog) * 0x1e | (0x1e >= (int)cPar.chainLog) * cPar.chainLog;
  uVar7 = (uint)(0x1e < (int)cPar.hashLog) * 0x1e | (0x1e >= (int)cPar.hashLog) * cPar.hashLog;
  uVar8 = (uint)(0x1e < (int)cPar.searchLog) * 0x1e | (0x1e >= (int)cPar.searchLog) * cPar.searchLog
  ;
  uVar4 = cPar.minMatch;
  uVar6 = cPar.targetLength;
  uVar4 = (uint)(7 < (int)uVar4) * 7 | (7 >= (int)uVar4) * uVar4;
  uVar6 = (uint)(0x20000 < (int)uVar6) * 0x20000 | (0x20000 >= (int)uVar6) * uVar6;
  cPar_00.strategy = ZVar1;
  cPar_00.targetLength = (-1 < (int)uVar6) * uVar6;
  cPar_00.chainLog = (uint)((int)uVar5 < 6) * 6 | ((int)uVar5 >= 6) * uVar5;
  cPar_00.windowLog = (uint)((int)uVar3 < 10) * 10 | ((int)uVar3 >= 10) * uVar3;
  cPar_00.hashLog = (uint)((int)uVar7 < 6) * 6 | ((int)uVar7 >= 6) * uVar7;
  cPar_00.searchLog = (uint)((int)uVar8 < 1) | ((int)uVar8 >= 1) * uVar8;
  cPar_00.minMatch = (uint)((int)uVar4 < 3) * 3 | ((int)uVar4 >= 3) * uVar4;
  ZSTD_adjustCParams_internal
            (__return_storage_ptr__,cPar_00,srcSize | -(ulong)(srcSize == 0),dictSize,
             ZSTD_cpm_unknown,ZSTD_ps_auto);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_clampCParams(ZSTD_compressionParameters cParams)
{
#   define CLAMP_TYPE(cParam, val, type) {                                \
        ZSTD_bounds const bounds = ZSTD_cParam_getBounds(cParam);         \
        if ((int)val<bounds.lowerBound) val=(type)bounds.lowerBound;      \
        else if ((int)val>bounds.upperBound) val=(type)bounds.upperBound; \
    }
#   define CLAMP(cParam, val) CLAMP_TYPE(cParam, val, unsigned)
    CLAMP(ZSTD_c_windowLog, cParams.windowLog);
    CLAMP(ZSTD_c_chainLog,  cParams.chainLog);
    CLAMP(ZSTD_c_hashLog,   cParams.hashLog);
    CLAMP(ZSTD_c_searchLog, cParams.searchLog);
    CLAMP(ZSTD_c_minMatch,  cParams.minMatch);
    CLAMP(ZSTD_c_targetLength,cParams.targetLength);
    CLAMP_TYPE(ZSTD_c_strategy,cParams.strategy, ZSTD_strategy);
    return cParams;
}